

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,VariableDeclarationNode *node)

{
  string *psVar1;
  shared_ptr<RuntimeSymbol> *this_00;
  int in_ECX;
  void *__child_stack;
  VariableDeclarationNode *in_RSI;
  long in_RDI;
  void *in_R8;
  __single_object symbol;
  shared_ptr<ExpressionNode> value;
  TypeName type;
  string name;
  shared_ptr<ExpressionNode> *in_stack_ffffffffffffff18;
  shared_ptr<ExpressionNode> *in_stack_ffffffffffffff20;
  Context *in_stack_ffffffffffffff70;
  shared_ptr<ExpressionNode> *in_stack_ffffffffffffff78;
  _Elt_pointer in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  _Elt_pointer in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  Context *in_stack_ffffffffffffffa0;
  string local_30 [32];
  VariableDeclarationNode *local_10;
  
  local_10 = in_RSI;
  psVar1 = VariableDeclarationNode::getName_abi_cxx11_(in_RSI);
  std::__cxx11::string::string(local_30,(string *)psVar1);
  VariableDeclarationNode::getType(local_10);
  VariableDeclarationNode::getValue(local_10);
  std::shared_ptr<ExpressionNode>::shared_ptr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Context::clone((Context *)&stack0xffffffffffffff50,(__fn *)(in_RDI + 0x10),__child_stack,in_ECX,
                 in_R8);
  std::
  make_unique<RuntimeVariableSymbol,std::__cxx11::string_const&,TypeName_const&,std::shared_ptr<ExpressionNode>&,Context>
            (in_stack_ffffffffffffff88,(TypeName *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  Context::~Context((Context *)0x18c544);
  this_00 = (shared_ptr<RuntimeSymbol> *)(in_RDI + 0x10);
  std::shared_ptr<RuntimeSymbol>::
  shared_ptr<RuntimeVariableSymbol,std::default_delete<RuntimeVariableSymbol>,void>
            (this_00,(unique_ptr<RuntimeVariableSymbol,_std::default_delete<RuntimeVariableSymbol>_>
                      *)in_stack_ffffffffffffff18);
  Context::addSymbol(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (shared_ptr<RuntimeSymbol> *)in_stack_ffffffffffffff90);
  std::shared_ptr<RuntimeSymbol>::~shared_ptr((shared_ptr<RuntimeSymbol> *)0x18c589);
  std::unique_ptr<RuntimeVariableSymbol,_std::default_delete<RuntimeVariableSymbol>_>::~unique_ptr
            ((unique_ptr<RuntimeVariableSymbol,_std::default_delete<RuntimeVariableSymbol>_> *)
             this_00);
  std::shared_ptr<ExpressionNode>::~shared_ptr((shared_ptr<ExpressionNode> *)0x18c5a3);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Executor::visit(const VariableDeclarationNode& node)
{
  const auto name = node.getName();
  const auto type = node.getType();
  auto value = node.getValue();

  auto symbol = std::make_unique<RuntimeVariableSymbol>(name, type, value, context_.clone());
  context_.addSymbol(name, std::move(symbol));
}